

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_coding.h
# Opt level: O0

uint32_t half_to_uint(uint16_t hv)

{
  ushort in_DI;
  float fVar1;
  undefined4 local_4;
  
  if ((in_DI & 0x8000) == 0) {
    if ((in_DI & 0x7c00) == 0x7c00) {
      if ((in_DI & 0x3ff) == 0) {
        local_4 = 0xffffffff;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      fVar1 = half_to_float(in_DI);
      local_4 = (uint32_t)(long)fVar1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline uint32_t
half_to_uint (uint16_t hv)
{
    /* replicating logic from imfmisc if negative or nan, return 0, if
     * inf, return uint32 max otherwise convert to float and cast to
     * uint */
    if (hv & 0x8000) return 0;
    if ((hv & 0x7c00) == 0x7c00)
    {
        if ((hv & 0x3ff) != 0) return 0;
        return UINT32_MAX;
    }
    return (uint32_t) (half_to_float (hv));
}